

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlFetchXMLCatalogFile(xmlCatalogEntryPtr catal)

{
  xmlChar *str1;
  xmlCatalogPrefer xVar1;
  int in_EAX;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  _xmlCatalogEntry *p_Var4;
  xmlDocPtr doc;
  xmlNodePtr node;
  xmlCatalogEntryPtr parent;
  xmlChar *pxVar5;
  xmlCatalogEntryPtr pxVar6;
  xmlCatalogPrefer prefer;
  
  if (catal->URL == (xmlChar *)0x0) {
    return in_EAX;
  }
  xmlRMutexLock(&xmlCatalogMutex);
  if (catal->children != (_xmlCatalogEntry *)0x0) goto LAB_00160e2f;
  if (xmlCatalogXMLFiles != (xmlHashTablePtr)0x0) {
    p_Var4 = (_xmlCatalogEntry *)xmlHashLookup(xmlCatalogXMLFiles,catal->URL);
    if (p_Var4 != (_xmlCatalogEntry *)0x0) {
      if (xmlDebugCatalogs != 0) {
        xmlCatalogPrintDebug("Found %s in file hash\n",catal->URL);
      }
      if (catal->type == XML_CATA_CATALOG) {
        p_Var4 = p_Var4->children;
      }
      catal->children = p_Var4;
      catal->dealloc = 0;
      goto LAB_00160e2f;
    }
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("%s not found in file hash\n",catal->URL);
    }
  }
  pxVar5 = catal->URL;
  if (pxVar5 != (xmlChar *)0x0) {
    prefer = catal->prefer;
    doc = xmlParseCatalogFile((char *)pxVar5);
    if (doc == (xmlDocPtr)0x0) {
      if (xmlDebugCatalogs != 0) {
        xmlCatalogPrintDebug("Failed to parse catalog %s\n",pxVar5);
      }
    }
    else {
      if (xmlDebugCatalogs != 0) {
        uVar2 = xmlGetThreadId();
        xmlCatalogPrintDebug("%d Parsing catalog %s\n",(ulong)uVar2,pxVar5);
      }
      node = xmlDocGetRootElement(doc);
      if (node == (xmlNodePtr)0x0) {
LAB_00160de8:
        xmlCatalogErr((xmlCatalogEntryPtr)0x0,(xmlNodePtr)doc,0x675,
                      "File %s is not an XML Catalog\n",pxVar5,(xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        iVar3 = xmlStrEqual(node->name,"catalog");
        if (((iVar3 == 0) || (node->ns == (xmlNs *)0x0)) ||
           (str1 = node->ns->href, str1 == (xmlChar *)0x0)) goto LAB_00160de8;
        iVar3 = xmlStrEqual(str1,(xmlChar *)"urn:oasis:names:tc:entity:xmlns:xml:catalog");
        if (iVar3 == 0) goto LAB_00160de8;
        parent = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,pxVar5,(xmlChar *)0x0,prefer,
                                    (xmlCatalogEntryPtr)0x0);
        if (parent != (xmlCatalogEntryPtr)0x0) {
          pxVar5 = xmlGetProp(node,(xmlChar *)"prefer");
          if (pxVar5 != (xmlChar *)0x0) {
            iVar3 = xmlStrEqual(pxVar5,"system");
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"public");
              xVar1 = XML_CATA_PREFER_PUBLIC;
              if (iVar3 == 0) {
                xmlCatalogErr((xmlCatalogEntryPtr)0x0,node,0x674,
                              "Invalid value for prefer: \'%s\'\n",pxVar5,(xmlChar *)0x0,
                              (xmlChar *)0x0);
                xVar1 = prefer;
              }
            }
            else {
              xVar1 = XML_CATA_PREFER_SYSTEM;
            }
            prefer = xVar1;
            (*xmlFree)(pxVar5);
          }
          xmlParseXMLCatalogNodeList(node->children,prefer,parent,(xmlCatalogEntryPtr)0x0);
          xmlFreeDoc(doc);
          pxVar6 = parent;
          if (catal->type == XML_CATA_CATALOG) {
            pxVar6 = parent->children;
          }
          catal->children = pxVar6;
          parent->dealloc = 1;
          if (xmlCatalogXMLFiles == (xmlHashTablePtr)0x0) {
            xmlCatalogXMLFiles = xmlHashCreate(10);
            if (xmlCatalogXMLFiles == (xmlHashTablePtr)0x0) goto LAB_00160e2f;
          }
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("%s added to file hash\n",catal->URL);
          }
          xmlHashAddEntry(xmlCatalogXMLFiles,catal->URL,parent);
          goto LAB_00160e2f;
        }
      }
      xmlFreeDoc(doc);
    }
  }
  catal->type = XML_CATA_BROKEN_CATALOG;
LAB_00160e2f:
  xmlRMutexUnlock(&xmlCatalogMutex);
  return extraout_EAX;
}

Assistant:

static int
xmlFetchXMLCatalogFile(xmlCatalogEntryPtr catal) {
    xmlCatalogEntryPtr doc;

    if (catal == NULL)
	return(-1);
    if (catal->URL == NULL)
	return(-1);

    /*
     * lock the whole catalog for modification
     */
    xmlRMutexLock(&xmlCatalogMutex);
    if (catal->children != NULL) {
	/* Okay someone else did it in the meantime */
	xmlRMutexUnlock(&xmlCatalogMutex);
	return(0);
    }

    if (xmlCatalogXMLFiles != NULL) {
	doc = (xmlCatalogEntryPtr)
	    xmlHashLookup(xmlCatalogXMLFiles, catal->URL);
	if (doc != NULL) {
	    if (xmlDebugCatalogs)
		xmlCatalogPrintDebug(
		    "Found %s in file hash\n", catal->URL);

	    if (catal->type == XML_CATA_CATALOG)
		catal->children = doc->children;
	    else
		catal->children = doc;
	    catal->dealloc = 0;
	    xmlRMutexUnlock(&xmlCatalogMutex);
	    return(0);
	}
	if (xmlDebugCatalogs)
	    xmlCatalogPrintDebug(
		"%s not found in file hash\n", catal->URL);
    }

    /*
     * Fetch and parse. Note that xmlParseXMLCatalogFile does not
     * use the existing catalog, there is no recursion allowed at
     * that level.
     */
    doc = xmlParseXMLCatalogFile(catal->prefer, catal->URL);
    if (doc == NULL) {
	catal->type = XML_CATA_BROKEN_CATALOG;
	xmlRMutexUnlock(&xmlCatalogMutex);
	return(-1);
    }

    if (catal->type == XML_CATA_CATALOG)
	catal->children = doc->children;
    else
	catal->children = doc;

    doc->dealloc = 1;

    if (xmlCatalogXMLFiles == NULL)
	xmlCatalogXMLFiles = xmlHashCreate(10);
    if (xmlCatalogXMLFiles != NULL) {
	if (xmlDebugCatalogs)
	    xmlCatalogPrintDebug(
		"%s added to file hash\n", catal->URL);
	xmlHashAddEntry(xmlCatalogXMLFiles, catal->URL, doc);
    }
    xmlRMutexUnlock(&xmlCatalogMutex);
    return(0);
}